

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O3

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  iterator iVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  pthread_mutex_t *__mutex;
  ulong uVar8;
  vector<float,_std::allocator<float>_> *pvVar9;
  size_type __n;
  float __x;
  float fVar10;
  float __x_00;
  float u2;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  pthread_mutex_t *local_48;
  long local_40;
  ulong local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    uVar6 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock(local_48);
    _Unwind_Resume(uVar6);
  }
  if (this->m_max_refinements <=
      (ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i)
  goto LAB_00112cc9;
  LOCK();
  (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
       (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
  uVar8 = (ulong)uVar1;
  __x = ldexpf(1.0,-uVar1);
  local_50 = __x + __x;
  fVar10 = ceilf((this->m_t_max - __x) / local_50);
  local_48 = __mutex;
  if ((uint)ABS(fVar10) < 0x7f800000) {
    if (ABS(fVar10) <= 2.1474836e+09) goto LAB_00112aed;
    local_5c = fVar10;
    policies::detail::raise_error<boost::math::rounding_error,float>
              ("boost::math::itrunc<%1%>(%1%)",
               "Value %1% can not be represented in the target integer type.",&local_5c);
    __n = 0;
  }
  else {
    local_5c = fVar10;
    policies::detail::raise_error<boost::math::rounding_error,float>
              ("boost::math::trunc<%1%>(%1%)",
               "Value %1% can not be represented in the target integer type.",&local_5c);
    fVar10 = 0.0;
LAB_00112aed:
    __n = (size_type)(int)fVar10;
  }
  std::vector<float,_std::allocator<float>_>::reserve
            ((this->m_abscissas).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
  std::vector<float,_std::allocator<float>_>::reserve
            ((this->m_weights).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
  fVar10 = this->m_t_max;
  uVar7 = 0;
  __x_00 = __x;
  local_40 = uVar8 * 3;
  local_38 = uVar8;
  while (lVar4 = local_40, __mutex = local_48, __x_00 < fVar10) {
    local_54 = this->m_t_crossover;
    bVar3 = __x_00 < local_54;
    pvVar9 = (this->m_abscissas).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8;
    local_58 = __x_00;
    fVar10 = sinhf(__x_00);
    fVar10 = fVar10 * 1.5707964;
    if (local_54 <= local_58) {
      local_4c = fVar10;
      local_54 = expf(fVar10);
      fVar10 = coshf(local_4c);
      local_5c = -1.0 / (fVar10 * local_54);
    }
    else {
      local_5c = tanhf(fVar10);
    }
    iVar2._M_current =
         (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
         ._M_finish;
    if (iVar2._M_current ==
        (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(pvVar9,iVar2,&local_5c);
    }
    else {
      *iVar2._M_current = local_5c;
      (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar2._M_current + 1;
    }
    uVar7 = uVar7 + bVar3;
    fVar10 = this->m_t_max;
    __x_00 = local_58 + local_50;
  }
  (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start[local_38] = uVar7;
  if (__x < fVar10) {
    do {
      pvVar9 = (vector<float,_std::allocator<float>_> *)
               ((long)&(((this->m_weights).
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data + lVar4 * 8);
      fVar10 = sinhf(__x);
      local_58 = coshf(fVar10 * 1.5707964);
      fVar10 = coshf(__x);
      local_5c = (fVar10 * 1.5707964) / (local_58 * local_58);
      iVar2._M_current =
           (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(pvVar9,iVar2,&local_5c)
        ;
      }
      else {
        *iVar2._M_current = local_5c;
        (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      __x = __x + local_50;
    } while (__x < this->m_t_max);
  }
LAB_00112cc9:
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }